

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O1

void __thiscall
fmt::v6::internal::basic_writer<fmt::v6::buffer_range<wchar_t>>::
write_padded<fmt::v6::internal::float_writer<wchar_t>>
          (basic_writer<fmt::v6::buffer_range<wchar_t>> *this,format_specs *specs,
          float_writer<wchar_t> *f)

{
  undefined8 *puVar1;
  long lVar2;
  byte bVar3;
  wchar_t *pwVar4;
  ulong uVar5;
  fill_t<wchar_t> *fill;
  size_t n;
  
  uVar5 = f->size_;
  n = (uint)specs->width - uVar5;
  if ((uint)specs->width < uVar5 || n == 0) {
    puVar1 = *(undefined8 **)this;
    lVar2 = puVar1[2];
    uVar5 = uVar5 + lVar2;
    if ((ulong)puVar1[3] < uVar5) {
      (**(code **)*puVar1)(puVar1,uVar5);
    }
    puVar1[2] = uVar5;
    pwVar4 = (wchar_t *)(lVar2 * 4 + puVar1[1]);
    uVar5 = (ulong)(byte)(f->specs_).field_0x5;
    if (uVar5 != 0) {
      *pwVar4 = (int)*(char *)((long)&basic_data<void>::signs + uVar5);
      pwVar4 = pwVar4 + 1;
    }
LAB_00183703:
    float_writer<wchar_t>::prettify<wchar_t*>(f,pwVar4);
    return;
  }
  puVar1 = *(undefined8 **)this;
  lVar2 = puVar1[2];
  uVar5 = (specs->fill).size_ * n + uVar5 + lVar2;
  if ((ulong)puVar1[3] < uVar5) {
    (**(code **)*puVar1)(puVar1,uVar5);
  }
  puVar1[2] = uVar5;
  pwVar4 = (wchar_t *)(lVar2 * 4 + puVar1[1]);
  fill = &specs->fill;
  bVar3 = specs->field_0x9 & 0xf;
  if (bVar3 == 3) {
    pwVar4 = fill<wchar_t*,wchar_t>(pwVar4,n >> 1,fill);
    uVar5 = (ulong)(byte)(f->specs_).field_0x5;
    if (uVar5 != 0) {
      *pwVar4 = (int)*(char *)((long)&basic_data<void>::signs + uVar5);
      pwVar4 = pwVar4 + 1;
    }
    pwVar4 = float_writer<wchar_t>::prettify<wchar_t*>(f,pwVar4);
    n = n - (n >> 1);
  }
  else {
    if (bVar3 == 2) {
      pwVar4 = fill<wchar_t*,wchar_t>(pwVar4,n,fill);
      uVar5 = (ulong)(byte)(f->specs_).field_0x5;
      if (uVar5 != 0) {
        *pwVar4 = (int)*(char *)((long)&basic_data<void>::signs + uVar5);
        pwVar4 = pwVar4 + 1;
      }
      goto LAB_00183703;
    }
    uVar5 = (ulong)(byte)(f->specs_).field_0x5;
    if (uVar5 != 0) {
      *pwVar4 = (int)*(char *)((long)&basic_data<void>::signs + uVar5);
      pwVar4 = pwVar4 + 1;
    }
    pwVar4 = float_writer<wchar_t>::prettify<wchar_t*>(f,pwVar4);
  }
  fill<wchar_t*,wchar_t>(pwVar4,n,fill);
  return;
}

Assistant:

void write_padded(const format_specs& specs, F&& f) {
    // User-perceived width (in code points).
    unsigned width = to_unsigned(specs.width);
    size_t size = f.size();  // The number of code units.
    size_t num_code_points = width != 0 ? f.width() : size;
    if (width <= num_code_points) return f(reserve(size));
    size_t padding = width - num_code_points;
    size_t fill_size = specs.fill.size();
    auto&& it = reserve(size + padding * fill_size);
    if (specs.align == align::right) {
      it = fill(it, padding, specs.fill);
      f(it);
    } else if (specs.align == align::center) {
      std::size_t left_padding = padding / 2;
      it = fill(it, left_padding, specs.fill);
      f(it);
      it = fill(it, padding - left_padding, specs.fill);
    } else {
      f(it);
      it = fill(it, padding, specs.fill);
    }
  }